

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

RandomNormalDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randomnormaldynamic(NeuralNetworkLayer *this)

{
  RandomNormalDynamicLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x49c) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x49c;
    this_00 = (RandomNormalDynamicLayerParams *)operator_new(0x28);
    RandomNormalDynamicLayerParams::RandomNormalDynamicLayerParams(this_00);
    (this->layer_).randomnormaldynamic_ = this_00;
  }
  return (RandomNormalDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomNormalDynamicLayerParams* NeuralNetworkLayer::mutable_randomnormaldynamic() {
  if (!has_randomnormaldynamic()) {
    clear_layer();
    set_has_randomnormaldynamic();
    layer_.randomnormaldynamic_ = new ::CoreML::Specification::RandomNormalDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomNormalDynamic)
  return layer_.randomnormaldynamic_;
}